

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

Header * __thiscall Imf_3_4::DeepScanLineInputFile::header(DeepScanLineInputFile *this)

{
  element_type *peVar1;
  int iVar2;
  mutex *__mutex;
  Header HStack_48;
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_mx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1->header_filled == false) {
      Context::header(&HStack_48,&this->_ctxt,peVar1->partNumber);
      Header::operator=(&((this->_data).
                          super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->header,&HStack_48);
      Header::~Header(&HStack_48);
      ((this->_data).
       super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->header_filled = true;
    }
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return &peVar1->header;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const Header&
DeepScanLineInputFile::header () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    if (!_data->header_filled)
    {
        _data->header = _ctxt.header (_data->partNumber);
        _data->header_filled = true;
    }
    return _data->header;
}